

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O1

bool gl4cts::CopyImage::Utils::isTargetMultilayer(GLenum target)

{
  if ((int)target < 0x8c1a) {
    if (target == 0x806f) {
      return true;
    }
    if (target == 0x8c18) {
      return true;
    }
  }
  else if (((target == 0x8c1a) || (target == 0x9102)) || (target == 0x9009)) {
    return true;
  }
  return false;
}

Assistant:

bool Utils::isTargetMultilayer(GLenum target)
{
	bool result = false;

	switch (target)
	{
	case GL_TEXTURE_1D_ARRAY:
	case GL_TEXTURE_2D_ARRAY:
	case GL_TEXTURE_2D_MULTISAMPLE_ARRAY:
	case GL_TEXTURE_3D:
	case GL_TEXTURE_CUBE_MAP_ARRAY:
		result = true;
		break;

	default:
		break;
	}

	return result;
}